

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::Person_PhoneNumber::MergeFrom(Person_PhoneNumber *this,Message *from)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50 [56];
  
  if ((Person_PhoneNumber *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O1/proto/messages.pb.cc"
               ,0x17c);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  if (*(undefined ***)from == &PTR__Person_PhoneNumber_0010eb08) {
    MergeFrom(this,(Person_PhoneNumber *)from);
  }
  else {
    google::protobuf::internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void Person_PhoneNumber::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:Messages.Person.PhoneNumber)
  GOOGLE_DCHECK_NE(&from, this);
  const Person_PhoneNumber* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<Person_PhoneNumber>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:Messages.Person.PhoneNumber)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:Messages.Person.PhoneNumber)
    MergeFrom(*source);
  }
}